

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetSourceFilePaths
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  cmListFileBacktrace *pcVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  cmGeneratorTarget *this_01;
  pointer pbVar3;
  size_type sVar4;
  bool bVar5;
  bool bVar8;
  TargetType TVar9;
  string *psVar10;
  bool bVar6;
  bool bVar7;
  cmLinkImplementationLibraries *pcVar11;
  cmake *cmakeInstance;
  cmFileSet *pcVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var13;
  _Alloc_hider _Var14;
  pointer item_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  pointer __args;
  cmBTStringRange cVar15;
  cmBTStringRange cVar16;
  cmBTStringRange cVar17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  string_view value;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_02;
  string_view str;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_2a0;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmList items;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  bool local_248;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_240;
  string genex;
  EvaluatedTargetPropertyEntries fileSetEntries;
  EvaluatedTargetPropertyEntries linkObjectsEntries;
  string local_1d8;
  EvaluatedTargetPropertyEntries linkInterfaceSourcesEntries;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_198;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_188;
  cmList debugProperties;
  cmGeneratorExpression ge;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueSrcs;
  EvaluatedTargetPropertyEntries entries;
  string local_f0;
  cmGeneratorExpressionDAGChecker dagChecker;
  string local_50 [32];
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->LocalGenerator->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == false) {
    cVar15 = cmTarget::GetSourceEntries_abi_cxx11_(this->Target);
    while (local_2a0 = cVar15.End._M_current, _Var13 = cVar15.Begin._M_current,
          _Var13._M_current != local_2a0._M_current) {
      std::__cxx11::string::string((string *)&dagChecker,(string *)_Var13._M_current);
      init_00._M_len = 1;
      init_00._M_array = (iterator)&dagChecker;
      cmList::cmList(&items,init_00);
      std::__cxx11::string::~string((string *)&dagChecker);
      pbVar3 = items.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__args = items.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; __args != pbVar3; __args = __args + 1
          ) {
        str._M_str = (__args->_M_dataplus)._M_p;
        str._M_len = __args->_M_string_length;
        bVar8 = cmHasLiteralPrefix<18ul>(str,(char (*) [18])"$<TARGET_OBJECTS:");
        if ((!bVar8) || ((__args->_M_dataplus)._M_p[__args->_M_string_length - 1] != '>')) {
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     __return_storage_ptr__,__args);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&items.Values);
      cVar15.End._M_current = local_2a0._M_current;
      cVar15.Begin._M_current = _Var13._M_current + 1;
    }
  }
  else {
    this_00 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&items,"CMAKE_DEBUG_TARGET_PROPERTIES",(allocator<char> *)&uniqueSrcs);
    psVar10 = (string *)cmMakefile::GetDefinition(this_00,(string *)&items);
    if (psVar10 == (string *)0x0) {
      psVar10 = &cmValue::Empty_abi_cxx11_;
    }
    std::__cxx11::string::string((string *)&dagChecker,(string *)psVar10);
    init._M_len = 1;
    init._M_array = (iterator)&dagChecker;
    cmList::cmList(&debugProperties,init);
    std::__cxx11::string::~string((string *)&dagChecker);
    std::__cxx11::string::~string((string *)&items);
    if (this->DebugSourcesDone == false) {
      bVar8 = ::cm::contains<cmList,_char[8],_0>(&debugProperties,(char (*) [8])0x7013f4);
    }
    else {
      bVar8 = false;
    }
    if (this->LocalGenerator->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
      this->DebugSourcesDone = true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"SOURCES",(allocator<char> *)&items);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,this,&local_f0,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_f0);
    items.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&items.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    items.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    items.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    EvaluateTargetPropertyEntries
              (&entries,this,config,(string *)&items,&dagChecker,&this->SourceEntries);
    std::__cxx11::string::~string((string *)&items);
    uniqueSrcs._M_h._M_buckets = &uniqueSrcs._M_h._M_single_bucket;
    uniqueSrcs._M_h._M_bucket_count = 1;
    uniqueSrcs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    uniqueSrcs._M_h._M_element_count = 0;
    uniqueSrcs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    uniqueSrcs._M_h._M_rehash_policy._M_next_resize = 0;
    uniqueSrcs._M_h._M_single_bucket = (__node_base_ptr)0x0;
    bVar5 = anon_unknown.dwarf_1798d2f::processSources
                      (this,&entries,__return_storage_ptr__,&uniqueSrcs,bVar8);
    linkInterfaceSourcesEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    linkInterfaceSourcesEntries._17_8_ = 0;
    linkInterfaceSourcesEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    linkInterfaceSourcesEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    linkInterfaceSourcesEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&items,"INTERFACE_SOURCES",(allocator<char> *)&genex);
    fileSetEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&fileSetEntries.Entries.
                   super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    fileSetEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    fileSetEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    fileSetEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    AddInterfaceEntries(this,config,(string *)&items,(string *)&fileSetEntries,&dagChecker,
                        &linkInterfaceSourcesEntries,No,Usage);
    std::__cxx11::string::~string((string *)&fileSetEntries);
    std::__cxx11::string::~string((string *)&items);
    bVar6 = anon_unknown.dwarf_1798d2f::processSources
                      (this,&linkInterfaceSourcesEntries,__return_storage_ptr__,&uniqueSrcs,bVar8);
    TVar9 = GetType(this);
    if (TVar9 == OBJECT_LIBRARY) {
      bVar7 = false;
    }
    else {
      linkObjectsEntries.Entries.
      super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      linkObjectsEntries._17_8_ = 0;
      linkObjectsEntries.Entries.
      super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      linkObjectsEntries.Entries.
      super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      linkObjectsEntries.Entries.
      super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      pcVar11 = GetLinkImplementationLibraries(this,config,Usage);
      if (pcVar11 != (cmLinkImplementationLibraries *)0x0) {
        linkObjectsEntries.HadContextSensitiveCondition = pcVar11->HadContextSensitiveCondition;
        item_00 = (pcVar11->Libraries).
                  super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pcVar2 = (pcVar11->Libraries).
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        while( true ) {
          if (item_00 == pcVar2) break;
          this_01 = (item_00->super_cmLinkItem).Target;
          if (this_01 != (cmGeneratorTarget *)0x0) {
            TVar9 = GetType(this_01);
            if (TVar9 == OBJECT_LIBRARY) {
              cmGlobalGenerator::IndexGeneratorTargetUniquely_abi_cxx11_
                        ((string *)&fileSetEntries,this->LocalGenerator->GlobalGenerator,
                         (item_00->super_cmLinkItem).Target);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &items,"$<TARGET_OBJECTS:",(string *)&fileSetEntries);
              std::operator+(&genex,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&items,">");
              std::__cxx11::string::~string((string *)&items);
              cmakeInstance = cmMakefile::GetCMakeInstance(this->Makefile);
              pcVar1 = &(item_00->super_cmLinkItem).Backtrace;
              std::
              __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ::__shared_ptr(&local_188,
                             (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                              *)pcVar1);
              cmGeneratorExpression::cmGeneratorExpression
                        (&ge,cmakeInstance,(cmListFileBacktrace *)&local_188);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_188._M_refcount);
              std::__cxx11::string::string(local_50,(string *)&genex);
              cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
              std::__cxx11::string::~string(local_50);
              *(undefined1 *)
               ((long)cge._M_t.
                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl +
               0x49) = 1;
              std::
              __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ::__shared_ptr(&local_198,
                             (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                              *)pcVar1);
              EvaluatedTargetPropertyEntry::EvaluatedTargetPropertyEntry
                        ((EvaluatedTargetPropertyEntry *)&items,item_00,
                         (cmListFileBacktrace *)&local_198);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_198._M_refcount);
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              local_1d8._M_string_length = 0;
              local_1d8.field_2._M_local_buf[0] = '\0';
              psVar10 = cmCompiledGeneratorExpression::Evaluate
                                  ((cmCompiledGeneratorExpression *)
                                   cge._M_t.
                                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                   _M_head_impl,this->LocalGenerator,config,this,&dagChecker,
                                   (cmGeneratorTarget *)0x0,&local_1d8);
              value._M_str = (psVar10->_M_dataplus)._M_p;
              value._M_len = psVar10->_M_string_length;
              cmList::append(&local_260,value,No);
              std::__cxx11::string::~string((string *)&local_1d8);
              if (*(char *)((long)cge._M_t.
                                  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                  _M_head_impl + 0x130) == '\x01') {
                local_248 = true;
              }
              std::
              vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
              emplace_back<EvaluatedTargetPropertyEntry>
                        (&linkObjectsEntries.Entries,(EvaluatedTargetPropertyEntry *)&items);
              EvaluatedTargetPropertyEntry::~EvaluatedTargetPropertyEntry
                        ((EvaluatedTargetPropertyEntry *)&items);
              std::
              unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ::~unique_ptr(&cge);
              cmGeneratorExpression::~cmGeneratorExpression(&ge);
              std::__cxx11::string::~string((string *)&genex);
              std::__cxx11::string::~string((string *)&fileSetEntries);
            }
          }
          item_00 = item_00 + 1;
        }
      }
      bVar7 = anon_unknown.dwarf_1798d2f::processSources
                        (this,&linkObjectsEntries,__return_storage_ptr__,&uniqueSrcs,bVar8);
      std::vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
      ~vector(&linkObjectsEntries.Entries);
    }
    fileSetEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    fileSetEntries._17_8_ = 0;
    fileSetEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fileSetEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    fileSetEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    cVar16 = cmTarget::GetHeaderSetsEntries_abi_cxx11_(this->Target);
    while (local_240 = cVar16.End._M_current, _Var13 = cVar16.Begin._M_current,
          _Var13._M_current != local_240._M_current) {
      std::__cxx11::string::string((string *)&items,(string *)_Var13._M_current);
      init_01._M_len = 1;
      init_01._M_array = (iterator)&items;
      cmList::cmList((cmList *)&genex,init_01);
      std::__cxx11::string::~string((string *)&items);
      sVar4 = genex._M_string_length;
      for (_Var14 = genex._M_dataplus; _Var14._M_p != (pointer)sVar4;
          _Var14._M_p = _Var14._M_p + 0x20) {
        pcVar12 = cmTarget::GetFileSet(this->Target,(string *)_Var14._M_p);
        anon_unknown.dwarf_1798d2f::addFileSetEntry(this,config,&dagChecker,pcVar12,&fileSetEntries)
        ;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&genex);
      cVar16.End._M_current = local_240._M_current;
      cVar16.Begin._M_current = _Var13._M_current + 1;
    }
    cVar17 = cmTarget::GetCxxModuleSetsEntries_abi_cxx11_(this->Target);
    while (local_240 = cVar17.End._M_current, _Var13 = cVar17.Begin._M_current,
          _Var13._M_current != local_240._M_current) {
      std::__cxx11::string::string((string *)&items,(string *)_Var13._M_current);
      init_02._M_len = 1;
      init_02._M_array = (iterator)&items;
      cmList::cmList((cmList *)&genex,init_02);
      std::__cxx11::string::~string((string *)&items);
      sVar4 = genex._M_string_length;
      for (_Var14 = genex._M_dataplus; _Var14._M_p != (pointer)sVar4;
          _Var14._M_p = _Var14._M_p + 0x20) {
        pcVar12 = cmTarget::GetFileSet(this->Target,(string *)_Var14._M_p);
        anon_unknown.dwarf_1798d2f::addFileSetEntry(this,config,&dagChecker,pcVar12,&fileSetEntries)
        ;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&genex);
      cVar17.End._M_current = local_240._M_current;
      cVar17.Begin._M_current = _Var13._M_current + 1;
    }
    bVar8 = anon_unknown.dwarf_1798d2f::processSources
                      (this,&fileSetEntries,__return_storage_ptr__,&uniqueSrcs,bVar8);
    this->SourcesAreContextDependent = (uint)(byte)((bVar5 || bVar6) | bVar7 | bVar8);
    std::vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
    ~vector(&fileSetEntries.Entries);
    std::vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
    ~vector(&linkInterfaceSourcesEntries.Entries);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&uniqueSrcs._M_h);
    std::vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
    ~vector(&entries.Entries);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&debugProperties.Values);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetSourceFilePaths(
  std::string const& config) const
{
  std::vector<BT<std::string>> files;

  if (!this->LocalGenerator->GetGlobalGenerator()->GetConfigureDoneCMP0026()) {
    // At configure-time, this method can be called as part of getting the
    // LOCATION property or to export() a file to be include()d.  However
    // there is no cmGeneratorTarget at configure-time, so search the SOURCES
    // for TARGET_OBJECTS instead for backwards compatibility with OLD
    // behavior of CMP0024 and CMP0026 only.

    cmBTStringRange sourceEntries = this->Target->GetSourceEntries();
    for (auto const& entry : sourceEntries) {
      cmList items{ entry.Value };
      for (auto const& item : items) {
        if (cmHasLiteralPrefix(item, "$<TARGET_OBJECTS:") &&
            item.back() == '>') {
          continue;
        }
        files.emplace_back(item);
      }
    }
    return files;
  }

  cmList debugProperties{ this->Makefile->GetDefinition(
    "CMAKE_DEBUG_TARGET_PROPERTIES") };
  bool debugSources =
    !this->DebugSourcesDone && cm::contains(debugProperties, "SOURCES");

  if (this->LocalGenerator->GetGlobalGenerator()->GetConfigureDoneCMP0026()) {
    this->DebugSourcesDone = true;
  }

  cmGeneratorExpressionDAGChecker dagChecker(this, "SOURCES", nullptr,
                                             nullptr);

  EvaluatedTargetPropertyEntries entries = EvaluateTargetPropertyEntries(
    this, config, std::string(), &dagChecker, this->SourceEntries);

  std::unordered_set<std::string> uniqueSrcs;
  bool contextDependentDirectSources =
    processSources(this, entries, files, uniqueSrcs, debugSources);

  // Collect INTERFACE_SOURCES of all direct link-dependencies.
  EvaluatedTargetPropertyEntries linkInterfaceSourcesEntries;
  AddInterfaceEntries(this, config, "INTERFACE_SOURCES", std::string(),
                      &dagChecker, linkInterfaceSourcesEntries,
                      IncludeRuntimeInterface::No, LinkInterfaceFor::Usage);
  bool contextDependentInterfaceSources = processSources(
    this, linkInterfaceSourcesEntries, files, uniqueSrcs, debugSources);

  // Collect TARGET_OBJECTS of direct object link-dependencies.
  bool contextDependentObjects = false;
  if (this->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    EvaluatedTargetPropertyEntries linkObjectsEntries;
    AddObjectEntries(this, config, &dagChecker, linkObjectsEntries);
    contextDependentObjects = processSources(this, linkObjectsEntries, files,
                                             uniqueSrcs, debugSources);
    // Note that for imported targets or multi-config generators supporting
    // cross-config builds the paths to the object files must be per-config,
    // so contextDependentObjects will be true here even if object libraries
    // are specified without per-config generator expressions.
  }

  // Collect this target's file sets.
  EvaluatedTargetPropertyEntries fileSetEntries;
  AddFileSetEntries(this, config, &dagChecker, fileSetEntries);
  bool contextDependentFileSets =
    processSources(this, fileSetEntries, files, uniqueSrcs, debugSources);

  // Determine if sources are context-dependent or not.
  if (!contextDependentDirectSources && !contextDependentInterfaceSources &&
      !contextDependentObjects && !contextDependentFileSets) {
    this->SourcesAreContextDependent = Tribool::False;
  } else {
    this->SourcesAreContextDependent = Tribool::True;
  }

  return files;
}